

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

void drwav_u8_to_s16(drwav_int16 *pOut,drwav_uint8 *pIn,size_t sampleCount)

{
  size_t sVar1;
  
  if (sampleCount != 0) {
    sVar1 = 0;
    do {
      pOut[sVar1] = (ushort)pIn[sVar1] << 8 ^ 0x8000;
      sVar1 = sVar1 + 1;
    } while (sampleCount != sVar1);
  }
  return;
}

Assistant:

DRWAV_API void drwav_u8_to_s16(drwav_int16* pOut, const drwav_uint8* pIn, size_t sampleCount)
{
    int r;
    size_t i;
    for (i = 0; i < sampleCount; ++i) {
        int x = pIn[i];
        r = x << 8;
        r = r - 32768;
        pOut[i] = (short)r;
    }
}